

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_horizontal_14_sse2
               (uint16_t *s,int pitch,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  byte bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined8 uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  long lVar35;
  uint16_t *puVar36;
  ulong uVar37;
  uint16_t *puVar38;
  long lVar39;
  short sVar40;
  undefined1 auVar41 [16];
  short sVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined4 uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  short sVar55;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  short sVar67;
  short sVar68;
  short sVar71;
  short sVar72;
  short sVar73;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined4 uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  short sVar82;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  short sVar90;
  undefined1 auVar91 [16];
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  __m128i flat_pq [3];
  __m128i q [7];
  __m128i p [7];
  undefined1 auStack_258 [16];
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_208;
  short sStack_206;
  short sStack_204;
  short sStack_202;
  short sStack_200;
  short sStack_1fe;
  short sStack_1fc;
  short sStack_1fa;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  undefined1 local_1e8 [16];
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  undefined2 uStack_1b0;
  undefined2 uStack_1ae;
  undefined2 uStack_1ac;
  undefined2 uStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  undefined2 uStack_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  ushort local_178;
  ushort uStack_176;
  ushort uStack_174;
  ushort uStack_172;
  ushort uStack_170;
  ushort uStack_16e;
  ushort uStack_16c;
  ushort uStack_16a;
  ushort local_168;
  ushort uStack_166;
  ushort uStack_164;
  ushort uStack_162;
  ushort uStack_160;
  ushort uStack_15e;
  ushort uStack_15c;
  ushort uStack_15a;
  ushort local_158;
  ushort uStack_156;
  ushort uStack_154;
  ushort uStack_152;
  ushort uStack_150;
  ushort uStack_14e;
  ushort uStack_14c;
  ushort uStack_14a;
  ushort local_148;
  ushort uStack_146;
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_140;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  ushort local_138;
  ushort uStack_136;
  ushort uStack_134;
  ushort uStack_132;
  ushort uStack_130;
  ushort uStack_12e;
  ushort uStack_12c;
  ushort uStack_12a;
  ushort local_128;
  ushort uStack_126;
  ushort uStack_124;
  ushort uStack_122;
  ushort uStack_120;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  ushort local_118;
  ushort uStack_116;
  ushort uStack_114;
  ushort uStack_112;
  ushort uStack_110;
  ushort uStack_10e;
  ushort uStack_10c;
  ushort uStack_10a;
  ushort local_108;
  ushort uStack_106;
  ushort uStack_104;
  ushort uStack_102;
  ushort uStack_100;
  ushort uStack_fe;
  ushort uStack_fc;
  ushort uStack_fa;
  ushort local_f8;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  undefined8 uStack_e0;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  __m128i pq [7];
  
  lVar35 = (long)pitch;
  puVar38 = s + -lVar35;
  lVar39 = 0;
  puVar36 = s;
  do {
    *(undefined8 *)((long)pq[0] + lVar39 + 8) = *(undefined8 *)puVar38;
    *(undefined8 *)((long)pq[1] + lVar39) = 0;
    *(undefined8 *)((long)&local_e8 + lVar39) = *(undefined8 *)puVar36;
    *(undefined8 *)((long)&uStack_e0 + lVar39) = 0;
    puVar38 = puVar38 + -lVar35;
    puVar36 = puVar36 + lVar35;
    lVar39 = lVar39 + 0x10;
  } while (lVar39 != 0x70);
  auVar52 = *(undefined1 (*) [16])blimit;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar52._0_13_;
  auVar2[0xe] = auVar52[7];
  auVar5[0xc] = auVar52[6];
  auVar5._0_12_ = auVar52._0_12_;
  auVar5._13_2_ = auVar2._13_2_;
  auVar8[0xb] = 0;
  auVar8._0_11_ = auVar52._0_11_;
  auVar8._12_3_ = auVar5._12_3_;
  auVar11[10] = auVar52[5];
  auVar11._0_10_ = auVar52._0_10_;
  auVar11._11_4_ = auVar8._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar52._0_9_;
  auVar14._10_5_ = auVar11._10_5_;
  auVar17[8] = auVar52[4];
  auVar17._0_8_ = auVar52._0_8_;
  auVar17._9_6_ = auVar14._9_6_;
  auVar26._7_8_ = 0;
  auVar26._0_7_ = auVar17._8_7_;
  auVar29._1_8_ = SUB158(auVar26 << 0x40,7);
  auVar29[0] = auVar52[3];
  auVar29._9_6_ = 0;
  auVar30._1_10_ = SUB1510(auVar29 << 0x30,5);
  auVar30[0] = auVar52[2];
  auVar30._11_4_ = 0;
  auVar20[2] = auVar52[1];
  auVar20._0_2_ = auVar52._0_2_;
  auVar20._3_12_ = SUB1512(auVar30 << 0x20,3);
  auVar53._0_2_ = auVar52._0_2_ & 0xff;
  auVar53._2_13_ = auVar20._2_13_;
  auVar53[0xf] = 0;
  auVar52 = *(undefined1 (*) [16])limit;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar52._0_13_;
  auVar3[0xe] = auVar52[7];
  auVar6[0xc] = auVar52[6];
  auVar6._0_12_ = auVar52._0_12_;
  auVar6._13_2_ = auVar3._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar52._0_11_;
  auVar9._12_3_ = auVar6._12_3_;
  auVar12[10] = auVar52[5];
  auVar12._0_10_ = auVar52._0_10_;
  auVar12._11_4_ = auVar9._11_4_;
  auVar15[9] = 0;
  auVar15._0_9_ = auVar52._0_9_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar18[8] = auVar52[4];
  auVar18._0_8_ = auVar52._0_8_;
  auVar18._9_6_ = auVar15._9_6_;
  auVar27._7_8_ = 0;
  auVar27._0_7_ = auVar18._8_7_;
  auVar31._1_8_ = SUB158(auVar27 << 0x40,7);
  auVar31[0] = auVar52[3];
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = auVar52[2];
  auVar32._11_4_ = 0;
  auVar21[2] = auVar52[1];
  auVar21._0_2_ = auVar52._0_2_;
  auVar21._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar46._0_2_ = auVar52._0_2_ & 0xff;
  auVar46._2_13_ = auVar21._2_13_;
  auVar46[0xf] = 0;
  bVar1 = (char)bd - 1U & 0x1f;
  auVar52 = *(undefined1 (*) [16])thresh;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar52._0_13_;
  auVar4[0xe] = auVar52[7];
  auVar7[0xc] = auVar52[6];
  auVar7._0_12_ = auVar52._0_12_;
  auVar7._13_2_ = auVar4._13_2_;
  auVar10[0xb] = 0;
  auVar10._0_11_ = auVar52._0_11_;
  auVar10._12_3_ = auVar7._12_3_;
  auVar13[10] = auVar52[5];
  auVar13._0_10_ = auVar52._0_10_;
  auVar13._11_4_ = auVar10._11_4_;
  auVar16[9] = 0;
  auVar16._0_9_ = auVar52._0_9_;
  auVar16._10_5_ = auVar13._10_5_;
  auVar19[8] = auVar52[4];
  auVar19._0_8_ = auVar52._0_8_;
  auVar19._9_6_ = auVar16._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar19._8_7_;
  auVar33._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar33[0] = auVar52[3];
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = auVar52[2];
  auVar34._11_4_ = 0;
  auVar22[2] = auVar52[1];
  auVar22._0_2_ = auVar52._0_2_;
  auVar22._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar56._0_2_ = auVar52._0_2_ & 0xff;
  auVar56._2_13_ = auVar22._2_13_;
  auVar56[0xf] = 0;
  auVar52 = ZEXT416((uint)(1 << bVar1));
  lVar39 = 0;
  do {
    *(undefined8 *)((long)&local_248 + lVar39) = *(undefined8 *)((long)pq[0] + lVar39 + 8);
    *(undefined8 *)((long)&sStack_240 + lVar39) = *(undefined8 *)((long)&local_e8 + lVar39);
    lVar39 = lVar39 + 0x10;
  } while (lVar39 != 0x70);
  auVar50 = ZEXT416(bd - 8);
  auVar53 = psllw(auVar53,auVar50);
  auVar46 = psllw(auVar46,auVar50);
  auVar74 = psllw(auVar56,auVar50);
  auVar69._2_2_ = sStack_246;
  auVar69._0_2_ = local_248;
  auVar69._4_2_ = sStack_244;
  auVar69._6_2_ = sStack_242;
  auVar41._2_2_ = sStack_23e;
  auVar41._0_2_ = sStack_240;
  auVar41._4_2_ = sStack_23c;
  auVar41._6_2_ = sStack_23a;
  auVar69._10_2_ = sStack_236;
  auVar69._8_2_ = local_238;
  auVar69._12_2_ = sStack_234;
  auVar69._14_2_ = sStack_232;
  auVar41._10_2_ = sStack_22e;
  auVar41._8_2_ = sStack_230;
  auVar41._12_2_ = sStack_22c;
  auVar41._14_2_ = sStack_22a;
  auVar56 = psubusw(auVar69,auVar41);
  auVar76 = psubusw(auVar41,auVar69);
  auVar76 = auVar76 | auVar56;
  auVar56 = paddusw(auVar76,auVar76);
  auVar57._0_8_ = auVar56._0_8_;
  auVar57._8_8_ = 0;
  auVar77._0_2_ = auVar76._8_2_ >> 1;
  auVar77._2_2_ = auVar76._10_2_ >> 1;
  auVar77._4_2_ = auVar76._12_2_ >> 1;
  auVar77._6_2_ = auVar76._14_2_ >> 1;
  auVar77._8_8_ = 0;
  auVar56 = paddusw(auVar77,auVar57);
  auVar56 = auVar56 ^ _DAT_004d59a0;
  auVar53 = auVar53 ^ _DAT_004d59a0;
  auVar78._0_2_ = -(ushort)(auVar53._0_2_ < auVar56._0_2_);
  auVar78._2_2_ = -(ushort)(auVar53._2_2_ < auVar56._2_2_);
  auVar78._4_2_ = -(ushort)(auVar53._4_2_ < auVar56._4_2_);
  auVar78._6_2_ = -(ushort)(auVar53._6_2_ < auVar56._6_2_);
  auVar78._8_2_ = -(ushort)(auVar53._8_2_ < auVar56._8_2_);
  auVar78._10_2_ = -(ushort)(auVar53._10_2_ < auVar56._10_2_);
  auVar78._12_2_ = -(ushort)(auVar53._12_2_ < auVar56._12_2_);
  auVar78._14_2_ = -(ushort)(auVar53._14_2_ < auVar56._14_2_);
  auVar57 = paddusw(_DAT_00510320,auVar46);
  auVar57 = auVar57 & auVar78;
  auVar76._2_2_ = sStack_246;
  auVar76._0_2_ = local_248;
  auVar76._4_2_ = sStack_244;
  auVar76._6_2_ = sStack_242;
  auVar76._8_2_ = sStack_240;
  auVar76._10_2_ = sStack_23e;
  auVar76._12_2_ = sStack_23c;
  auVar76._14_2_ = sStack_23a;
  auVar108._2_2_ = sStack_236;
  auVar108._0_2_ = local_238;
  auVar108._4_2_ = sStack_234;
  auVar108._6_2_ = sStack_232;
  auVar108._8_2_ = sStack_230;
  auVar108._10_2_ = sStack_22e;
  auVar108._12_2_ = sStack_22c;
  auVar108._14_2_ = sStack_22a;
  auVar56 = psubusw(auVar76,auVar108);
  auVar53 = psubusw(auVar108,auVar76);
  auVar53 = auVar53 | auVar56;
  sVar100 = auVar53._0_2_;
  sVar104 = auVar53._8_2_;
  auVar79._0_2_ = (ushort)(sVar104 < sVar100) * sVar100 | (ushort)(sVar104 >= sVar100) * sVar104;
  sVar101 = auVar53._2_2_;
  sVar105 = auVar53._10_2_;
  auVar79._2_2_ = (ushort)(sVar105 < sVar101) * sVar101 | (ushort)(sVar105 >= sVar101) * sVar105;
  sVar102 = auVar53._4_2_;
  sVar106 = auVar53._12_2_;
  auVar79._4_2_ = (ushort)(sVar106 < sVar102) * sVar102 | (ushort)(sVar106 >= sVar102) * sVar106;
  sVar103 = auVar53._6_2_;
  sVar107 = auVar53._14_2_;
  auVar79._6_2_ = (ushort)(sVar107 < sVar103) * sVar103 | (ushort)(sVar107 >= sVar103) * sVar107;
  sVar61 = (ushort)(0 < sVar104) * sVar104;
  auVar79._8_2_ = sVar61;
  sVar55 = (ushort)(0 < sVar105) * sVar105;
  auVar79._10_2_ = sVar55;
  sVar62 = (ushort)(0 < sVar106) * sVar106;
  auVar79._12_2_ = sVar62;
  sVar63 = (ushort)(0 < sVar107) * sVar107;
  auVar79._14_2_ = sVar63;
  sVar64 = auVar57._0_2_;
  uVar92 = (sVar64 < (short)auVar79._0_2_) * auVar79._0_2_ |
           (ushort)(sVar64 >= (short)auVar79._0_2_) * sVar64;
  sVar64 = auVar57._2_2_;
  uVar93 = (sVar64 < (short)auVar79._2_2_) * auVar79._2_2_ |
           (ushort)(sVar64 >= (short)auVar79._2_2_) * sVar64;
  sVar64 = auVar57._4_2_;
  uVar94 = (sVar64 < (short)auVar79._4_2_) * auVar79._4_2_ |
           (ushort)(sVar64 >= (short)auVar79._4_2_) * sVar64;
  sVar64 = auVar57._6_2_;
  uVar95 = (sVar64 < (short)auVar79._6_2_) * auVar79._6_2_ |
           (ushort)(sVar64 >= (short)auVar79._6_2_) * sVar64;
  sVar64 = auVar57._8_2_;
  uVar96 = (ushort)(sVar64 < sVar61) * sVar61 | (ushort)(sVar64 >= sVar61) * sVar64;
  sVar61 = auVar57._10_2_;
  uVar97 = (ushort)(sVar61 < sVar55) * sVar55 | (ushort)(sVar61 >= sVar55) * sVar61;
  sVar55 = auVar57._12_2_;
  sVar61 = auVar57._14_2_;
  uVar98 = (ushort)(sVar55 < sVar62) * sVar62 | (ushort)(sVar55 >= sVar62) * sVar55;
  uVar99 = (ushort)(sVar61 < sVar63) * sVar63 | (ushort)(sVar61 >= sVar63) * sVar61;
  auVar79 = auVar79 ^ _DAT_004d59a0;
  auVar74 = auVar74 ^ _DAT_004d59a0;
  uVar75 = CONCAT22(-(ushort)(auVar74._2_2_ < auVar79._2_2_),
                    -(ushort)(auVar74._0_2_ < auVar79._0_2_));
  lVar39 = 0x20;
  do {
    auVar56 = psubusw(*(undefined1 (*) [16])((long)&local_248 + lVar39),
                      *(undefined1 (*) [16])(auStack_258 + lVar39));
    auVar53 = psubusw(*(undefined1 (*) [16])(auStack_258 + lVar39),
                      *(undefined1 (*) [16])((long)&local_248 + lVar39));
    auVar53 = auVar53 | auVar56;
    sVar55 = auVar53._0_2_;
    uVar92 = (ushort)((short)uVar92 < sVar55) * sVar55 | ((short)uVar92 >= sVar55) * uVar92;
    sVar55 = auVar53._2_2_;
    uVar93 = (ushort)((short)uVar93 < sVar55) * sVar55 | ((short)uVar93 >= sVar55) * uVar93;
    sVar55 = auVar53._4_2_;
    uVar94 = (ushort)((short)uVar94 < sVar55) * sVar55 | ((short)uVar94 >= sVar55) * uVar94;
    sVar55 = auVar53._6_2_;
    uVar95 = (ushort)((short)uVar95 < sVar55) * sVar55 | ((short)uVar95 >= sVar55) * uVar95;
    sVar55 = auVar53._8_2_;
    uVar96 = (ushort)((short)uVar96 < sVar55) * sVar55 | ((short)uVar96 >= sVar55) * uVar96;
    sVar55 = auVar53._10_2_;
    uVar97 = (ushort)((short)uVar97 < sVar55) * sVar55 | ((short)uVar97 >= sVar55) * uVar97;
    sVar55 = auVar53._12_2_;
    uVar98 = (ushort)((short)uVar98 < sVar55) * sVar55 | ((short)uVar98 >= sVar55) * uVar98;
    sVar55 = auVar53._14_2_;
    uVar99 = (ushort)((short)uVar99 < sVar55) * sVar55 | ((short)uVar99 >= sVar55) * uVar99;
    lVar39 = lVar39 + 0x10;
  } while (lVar39 != 0x40);
  auVar52 = pshuflw(auVar52,auVar52,0);
  uVar51 = auVar52._0_4_;
  auVar83._4_4_ = uVar51;
  auVar83._0_4_ = uVar51;
  auVar83._8_4_ = uVar51;
  auVar83._12_4_ = uVar51;
  uVar51 = (undefined4)
           (CONCAT26(-(ushort)(auVar74._6_2_ < auVar79._6_2_),
                     CONCAT24(-(ushort)(auVar74._4_2_ < auVar79._4_2_),uVar75)) >> 0x20);
  auVar91._4_4_ = uVar51;
  auVar91._0_4_ = uVar75;
  auVar91._8_4_ = uVar75;
  auVar91._12_4_ = uVar51;
  auVar80._0_2_ =
       ((short)uVar96 < (short)uVar92) * uVar92 | ((short)uVar96 >= (short)uVar92) * uVar96;
  auVar80._2_2_ =
       ((short)uVar97 < (short)uVar93) * uVar93 | ((short)uVar97 >= (short)uVar93) * uVar97;
  auVar80._4_2_ =
       ((short)uVar98 < (short)uVar94) * uVar94 | ((short)uVar98 >= (short)uVar94) * uVar98;
  auVar80._6_2_ =
       ((short)uVar99 < (short)uVar95) * uVar95 | ((short)uVar99 >= (short)uVar95) * uVar99;
  auVar80._8_2_ = (0 < (short)uVar96) * uVar96;
  auVar80._10_2_ = (0 < (short)uVar97) * uVar97;
  auVar80._12_2_ = (0 < (short)uVar98) * uVar98;
  auVar80._14_2_ = (0 < (short)uVar99) * uVar99;
  auVar52 = psubusw(auVar80,auVar46);
  auVar46 = psllw(_DAT_00510320,ZEXT416((uint)bd));
  auVar81._0_2_ = -(ushort)(auVar52._0_2_ == 0);
  auVar81._2_2_ = -(ushort)(auVar52._2_2_ == 0);
  auVar81._4_2_ = -(ushort)(auVar52._4_2_ == 0);
  auVar81._6_2_ = -(ushort)(auVar52._6_2_ == 0);
  auVar81._8_2_ = -(ushort)(auVar52._8_2_ == 0);
  auVar81._10_2_ = -(ushort)(auVar52._10_2_ == 0);
  auVar81._12_2_ = -(ushort)(auVar52._12_2_ == 0);
  auVar81._14_2_ = -(ushort)(auVar52._14_2_ == 0);
  auVar47._8_4_ = 0xffffffff;
  auVar47._0_8_ = 0xffffffffffffffff;
  auVar47._12_4_ = 0xffffffff;
  auVar52 = paddsw(auVar46,auVar47);
  auVar53 = psubsw(auVar52,auVar83);
  auVar56 = psubsw((undefined1  [16])0x0,auVar83);
  auVar46 = psubsw(auVar69,auVar83);
  auVar52 = psubsw(auVar41,auVar83);
  auVar108 = psubsw(auVar46,auVar52);
  sVar68 = auVar53._0_2_;
  sVar55 = auVar108._0_2_;
  uVar92 = (ushort)(sVar68 < sVar55) * sVar68 | (ushort)(sVar68 >= sVar55) * sVar55;
  sVar71 = auVar53._2_2_;
  sVar55 = auVar108._2_2_;
  uVar93 = (ushort)(sVar71 < sVar55) * sVar71 | (ushort)(sVar71 >= sVar55) * sVar55;
  sVar72 = auVar53._4_2_;
  sVar55 = auVar108._4_2_;
  uVar94 = (ushort)(sVar72 < sVar55) * sVar72 | (ushort)(sVar72 >= sVar55) * sVar55;
  sVar73 = auVar53._6_2_;
  sVar55 = auVar108._6_2_;
  uVar95 = (ushort)(sVar73 < sVar55) * sVar73 | (ushort)(sVar73 >= sVar55) * sVar55;
  sVar82 = auVar53._8_2_;
  sVar55 = auVar108._8_2_;
  uVar96 = (ushort)(sVar82 < sVar55) * sVar82 | (ushort)(sVar82 >= sVar55) * sVar55;
  sVar86 = auVar53._10_2_;
  sVar55 = auVar108._10_2_;
  uVar97 = (ushort)(sVar86 < sVar55) * sVar86 | (ushort)(sVar86 >= sVar55) * sVar55;
  sVar87 = auVar53._12_2_;
  sVar55 = auVar108._12_2_;
  sVar61 = auVar108._14_2_;
  uVar98 = (ushort)(sVar87 < sVar55) * sVar87 | (ushort)(sVar87 >= sVar55) * sVar55;
  sVar88 = auVar53._14_2_;
  uVar99 = (ushort)(sVar88 < sVar61) * sVar88 | (ushort)(sVar88 >= sVar61) * sVar61;
  sVar55 = auVar56._0_2_;
  auVar109._0_2_ = (ushort)((short)uVar92 < sVar55) * sVar55 | ((short)uVar92 >= sVar55) * uVar92;
  sVar61 = auVar56._2_2_;
  auVar109._2_2_ = (ushort)((short)uVar93 < sVar61) * sVar61 | ((short)uVar93 >= sVar61) * uVar93;
  sVar62 = auVar56._4_2_;
  auVar109._4_2_ = (ushort)((short)uVar94 < sVar62) * sVar62 | ((short)uVar94 >= sVar62) * uVar94;
  sVar63 = auVar56._6_2_;
  auVar109._6_2_ = (ushort)((short)uVar95 < sVar63) * sVar63 | ((short)uVar95 >= sVar63) * uVar95;
  sVar64 = auVar56._8_2_;
  auVar109._8_2_ = (ushort)((short)uVar96 < sVar64) * sVar64 | ((short)uVar96 >= sVar64) * uVar96;
  sVar65 = auVar56._10_2_;
  auVar109._10_2_ = (ushort)((short)uVar97 < sVar65) * sVar65 | ((short)uVar97 >= sVar65) * uVar97;
  sVar66 = auVar56._12_2_;
  auVar109._12_2_ = (ushort)((short)uVar98 < sVar66) * sVar66 | ((short)uVar98 >= sVar66) * uVar98;
  sVar67 = auVar56._14_2_;
  auVar109._14_2_ = (ushort)((short)uVar99 < sVar67) * sVar67 | ((short)uVar99 >= sVar67) * uVar99;
  auVar53 = psubsw(auVar109 >> 0x40 & auVar91,auVar109);
  auVar53 = psubsw(auVar53,auVar109);
  auVar53 = psubsw(auVar53,auVar109);
  sVar40 = auVar53._0_2_;
  uVar92 = (ushort)(sVar68 < sVar40) * sVar68 | (ushort)(sVar68 >= sVar40) * sVar40;
  sVar40 = auVar53._2_2_;
  uVar93 = (ushort)(sVar71 < sVar40) * sVar71 | (ushort)(sVar71 >= sVar40) * sVar40;
  sVar40 = auVar53._4_2_;
  uVar94 = (ushort)(sVar72 < sVar40) * sVar72 | (ushort)(sVar72 >= sVar40) * sVar40;
  sVar40 = auVar53._6_2_;
  uVar95 = (ushort)(sVar73 < sVar40) * sVar73 | (ushort)(sVar73 >= sVar40) * sVar40;
  sVar40 = auVar53._8_2_;
  uVar96 = (ushort)(sVar82 < sVar40) * sVar82 | (ushort)(sVar82 >= sVar40) * sVar40;
  sVar40 = auVar53._10_2_;
  uVar97 = (ushort)(sVar86 < sVar40) * sVar86 | (ushort)(sVar86 >= sVar40) * sVar40;
  sVar40 = auVar53._12_2_;
  sVar45 = auVar53._14_2_;
  uVar98 = (ushort)(sVar87 < sVar40) * sVar87 | (ushort)(sVar87 >= sVar40) * sVar40;
  uVar99 = (ushort)(sVar88 < sVar45) * sVar88 | (ushort)(sVar88 >= sVar45) * sVar45;
  auVar113._0_2_ = (ushort)((short)uVar92 < sVar55) * sVar55 | ((short)uVar92 >= sVar55) * uVar92;
  auVar113._2_2_ = (ushort)((short)uVar93 < sVar61) * sVar61 | ((short)uVar93 >= sVar61) * uVar93;
  auVar113._4_2_ = (ushort)((short)uVar94 < sVar62) * sVar62 | ((short)uVar94 >= sVar62) * uVar94;
  auVar113._6_2_ = (ushort)((short)uVar95 < sVar63) * sVar63 | ((short)uVar95 >= sVar63) * uVar95;
  auVar113._8_2_ = (ushort)((short)uVar96 < sVar64) * sVar64 | ((short)uVar96 >= sVar64) * uVar96;
  auVar113._10_2_ = (ushort)((short)uVar97 < sVar65) * sVar65 | ((short)uVar97 >= sVar65) * uVar97;
  auVar113._12_2_ = (ushort)((short)uVar98 < sVar66) * sVar66 | ((short)uVar98 >= sVar66) * uVar98;
  auVar113._14_2_ = (ushort)((short)uVar99 < sVar67) * sVar67 | ((short)uVar99 >= sVar67) * uVar99;
  auVar113 = auVar113 & auVar81;
  auVar110._0_8_ = auVar113._0_8_;
  auVar110._8_4_ = auVar113._0_4_;
  auVar110._12_4_ = auVar113._4_4_;
  auVar53 = paddsw(auVar110,_DAT_00510330);
  sVar40 = auVar53._0_2_;
  uVar92 = (ushort)(sVar68 < sVar40) * sVar68 | (ushort)(sVar68 >= sVar40) * sVar40;
  sVar40 = auVar53._2_2_;
  uVar93 = (ushort)(sVar71 < sVar40) * sVar71 | (ushort)(sVar71 >= sVar40) * sVar40;
  sVar40 = auVar53._4_2_;
  uVar94 = (ushort)(sVar72 < sVar40) * sVar72 | (ushort)(sVar72 >= sVar40) * sVar40;
  sVar40 = auVar53._6_2_;
  uVar95 = (ushort)(sVar73 < sVar40) * sVar73 | (ushort)(sVar73 >= sVar40) * sVar40;
  sVar40 = auVar53._8_2_;
  uVar96 = (ushort)(sVar82 < sVar40) * sVar82 | (ushort)(sVar82 >= sVar40) * sVar40;
  sVar40 = auVar53._10_2_;
  uVar97 = (ushort)(sVar86 < sVar40) * sVar86 | (ushort)(sVar86 >= sVar40) * sVar40;
  sVar40 = auVar53._12_2_;
  sVar45 = auVar53._14_2_;
  uVar98 = (ushort)(sVar87 < sVar40) * sVar87 | (ushort)(sVar87 >= sVar40) * sVar40;
  uVar99 = (ushort)(sVar88 < sVar45) * sVar88 | (ushort)(sVar88 >= sVar45) * sVar45;
  auVar111._0_2_ = (ushort)((short)uVar92 < sVar55) * sVar55 | ((short)uVar92 >= sVar55) * uVar92;
  auVar111._2_2_ = (ushort)((short)uVar93 < sVar61) * sVar61 | ((short)uVar93 >= sVar61) * uVar93;
  auVar111._4_2_ = (ushort)((short)uVar94 < sVar62) * sVar62 | ((short)uVar94 >= sVar62) * uVar94;
  auVar111._6_2_ = (ushort)((short)uVar95 < sVar63) * sVar63 | ((short)uVar95 >= sVar63) * uVar95;
  auVar111._8_2_ = (ushort)((short)uVar96 < sVar64) * sVar64 | ((short)uVar96 >= sVar64) * uVar96;
  auVar111._10_2_ = (ushort)((short)uVar97 < sVar65) * sVar65 | ((short)uVar97 >= sVar65) * uVar97;
  auVar111._12_2_ = (ushort)((short)uVar98 < sVar66) * sVar66 | ((short)uVar98 >= sVar66) * uVar98;
  auVar111._14_2_ = (ushort)((short)uVar99 < sVar67) * sVar67 | ((short)uVar99 >= sVar67) * uVar99;
  auVar53 = psraw(auVar111,3);
  auVar114._0_2_ = auVar53._0_2_ + 1;
  auVar114._2_2_ = auVar53._2_2_ + 1;
  auVar114._4_2_ = auVar53._4_2_ + 1;
  auVar114._6_2_ = auVar53._6_2_ + 1;
  auVar114._8_2_ = auVar53._0_2_ + 1;
  auVar114._10_2_ = auVar53._2_2_ + 1;
  auVar114._12_2_ = auVar53._4_2_ + 1;
  auVar114._14_2_ = auVar53._6_2_ + 1;
  auVar56 = psraw(auVar114,1);
  auVar48._8_8_ = SUB168(~auVar91 & auVar56,8);
  auVar48._0_8_ = auVar53._8_8_;
  auVar112._8_8_ = SUB168(~auVar91 & auVar56,0);
  auVar112._0_8_ = auVar53._0_8_;
  auVar52 = psubsw(auVar52,auVar112);
  auVar46 = paddsw(auVar48,auVar46);
  sVar40 = auVar52._0_2_;
  uVar92 = (ushort)(sVar68 < sVar40) * sVar68 | (ushort)(sVar68 >= sVar40) * sVar40;
  sVar40 = auVar52._2_2_;
  uVar93 = (ushort)(sVar71 < sVar40) * sVar71 | (ushort)(sVar71 >= sVar40) * sVar40;
  sVar40 = auVar52._4_2_;
  uVar94 = (ushort)(sVar72 < sVar40) * sVar72 | (ushort)(sVar72 >= sVar40) * sVar40;
  sVar40 = auVar52._6_2_;
  uVar95 = (ushort)(sVar73 < sVar40) * sVar73 | (ushort)(sVar73 >= sVar40) * sVar40;
  sVar40 = auVar52._8_2_;
  uVar96 = (ushort)(sVar82 < sVar40) * sVar82 | (ushort)(sVar82 >= sVar40) * sVar40;
  sVar40 = auVar52._10_2_;
  uVar97 = (ushort)(sVar86 < sVar40) * sVar86 | (ushort)(sVar86 >= sVar40) * sVar40;
  sVar40 = auVar52._12_2_;
  sVar45 = auVar52._14_2_;
  uVar98 = (ushort)(sVar87 < sVar40) * sVar87 | (ushort)(sVar87 >= sVar40) * sVar40;
  uVar99 = (ushort)(sVar88 < sVar45) * sVar88 | (ushort)(sVar88 >= sVar45) * sVar45;
  auVar42._0_2_ = (ushort)((short)uVar92 < sVar55) * sVar55 | ((short)uVar92 >= sVar55) * uVar92;
  auVar42._2_2_ = (ushort)((short)uVar93 < sVar61) * sVar61 | ((short)uVar93 >= sVar61) * uVar93;
  auVar42._4_2_ = (ushort)((short)uVar94 < sVar62) * sVar62 | ((short)uVar94 >= sVar62) * uVar94;
  auVar42._6_2_ = (ushort)((short)uVar95 < sVar63) * sVar63 | ((short)uVar95 >= sVar63) * uVar95;
  auVar42._8_2_ = (ushort)((short)uVar96 < sVar64) * sVar64 | ((short)uVar96 >= sVar64) * uVar96;
  auVar42._10_2_ = (ushort)((short)uVar97 < sVar65) * sVar65 | ((short)uVar97 >= sVar65) * uVar97;
  auVar42._12_2_ = (ushort)((short)uVar98 < sVar66) * sVar66 | ((short)uVar98 >= sVar66) * uVar98;
  auVar42._14_2_ = (ushort)((short)uVar99 < sVar67) * sVar67 | ((short)uVar99 >= sVar67) * uVar99;
  sVar40 = auVar46._0_2_;
  uVar92 = (ushort)(sVar68 < sVar40) * sVar68 | (ushort)(sVar68 >= sVar40) * sVar40;
  sVar68 = auVar46._2_2_;
  uVar93 = (ushort)(sVar71 < sVar68) * sVar71 | (ushort)(sVar71 >= sVar68) * sVar68;
  sVar68 = auVar46._4_2_;
  uVar94 = (ushort)(sVar72 < sVar68) * sVar72 | (ushort)(sVar72 >= sVar68) * sVar68;
  sVar68 = auVar46._6_2_;
  uVar95 = (ushort)(sVar73 < sVar68) * sVar73 | (ushort)(sVar73 >= sVar68) * sVar68;
  sVar68 = auVar46._8_2_;
  uVar96 = (ushort)(sVar82 < sVar68) * sVar82 | (ushort)(sVar82 >= sVar68) * sVar68;
  sVar68 = auVar46._10_2_;
  uVar97 = (ushort)(sVar86 < sVar68) * sVar86 | (ushort)(sVar86 >= sVar68) * sVar68;
  sVar68 = auVar46._12_2_;
  sVar71 = auVar46._14_2_;
  uVar98 = (ushort)(sVar87 < sVar68) * sVar87 | (ushort)(sVar87 >= sVar68) * sVar68;
  uVar99 = (ushort)(sVar88 < sVar71) * sVar88 | (ushort)(sVar88 >= sVar71) * sVar71;
  auVar49._0_2_ = (ushort)((short)uVar92 < sVar55) * sVar55 | ((short)uVar92 >= sVar55) * uVar92;
  auVar49._2_2_ = (ushort)((short)uVar93 < sVar61) * sVar61 | ((short)uVar93 >= sVar61) * uVar93;
  auVar49._4_2_ = (ushort)((short)uVar94 < sVar62) * sVar62 | ((short)uVar94 >= sVar62) * uVar94;
  auVar49._6_2_ = (ushort)((short)uVar95 < sVar63) * sVar63 | ((short)uVar95 >= sVar63) * uVar95;
  auVar49._8_2_ = (ushort)((short)uVar96 < sVar64) * sVar64 | ((short)uVar96 >= sVar64) * uVar96;
  auVar49._10_2_ = (ushort)((short)uVar97 < sVar65) * sVar65 | ((short)uVar97 >= sVar65) * uVar97;
  auVar49._12_2_ = (ushort)((short)uVar98 < sVar66) * sVar66 | ((short)uVar98 >= sVar66) * uVar98;
  auVar49._14_2_ = (ushort)((short)uVar99 < sVar67) * sVar67 | ((short)uVar99 >= sVar67) * uVar99;
  paddsw(auVar42,auVar83);
  paddsw(auVar49,auVar83);
  auVar52._2_2_ = sStack_226;
  auVar52._0_2_ = local_228;
  auVar52._4_2_ = sStack_224;
  auVar52._6_2_ = sStack_222;
  auVar52._8_2_ = sStack_220;
  auVar52._10_2_ = sStack_21e;
  auVar52._12_2_ = sStack_21c;
  auVar52._14_2_ = sStack_21a;
  auVar74._2_2_ = sStack_216;
  auVar74._0_2_ = local_218;
  auVar74._4_2_ = sStack_214;
  auVar74._6_2_ = sStack_212;
  auVar74._8_2_ = sStack_210;
  auVar74._10_2_ = sStack_20e;
  auVar74._12_2_ = sStack_20c;
  auVar74._14_2_ = sStack_20a;
  auVar46 = psubusw(auVar76,auVar52);
  auVar52 = psubusw(auVar52,auVar76);
  auVar52 = auVar52 | auVar46;
  sVar55 = auVar52._0_2_;
  uVar92 = (ushort)(sVar100 < sVar55) * sVar55 | (ushort)(sVar100 >= sVar55) * sVar100;
  sVar55 = auVar52._2_2_;
  uVar93 = (ushort)(sVar101 < sVar55) * sVar55 | (ushort)(sVar101 >= sVar55) * sVar101;
  sVar55 = auVar52._4_2_;
  uVar94 = (ushort)(sVar102 < sVar55) * sVar55 | (ushort)(sVar102 >= sVar55) * sVar102;
  sVar55 = auVar52._6_2_;
  uVar95 = (ushort)(sVar103 < sVar55) * sVar55 | (ushort)(sVar103 >= sVar55) * sVar103;
  sVar55 = auVar52._8_2_;
  uVar96 = (ushort)(sVar104 < sVar55) * sVar55 | (ushort)(sVar104 >= sVar55) * sVar104;
  sVar55 = auVar52._10_2_;
  uVar97 = (ushort)(sVar105 < sVar55) * sVar55 | (ushort)(sVar105 >= sVar55) * sVar105;
  sVar55 = auVar52._12_2_;
  uVar98 = (ushort)(sVar106 < sVar55) * sVar55 | (ushort)(sVar106 >= sVar55) * sVar106;
  sVar55 = auVar52._14_2_;
  uVar99 = (ushort)(sVar107 < sVar55) * sVar55 | (ushort)(sVar107 >= sVar55) * sVar107;
  auVar52 = psubusw(auVar76,auVar74);
  auVar53 = psubusw(auVar74,auVar76);
  auVar53 = auVar53 | auVar52;
  auVar46 = psllw(_DAT_00510320,auVar50);
  sVar55 = auVar53._0_2_;
  uVar92 = (sVar55 < (short)uVar92) * uVar92 | (ushort)(sVar55 >= (short)uVar92) * sVar55;
  sVar55 = auVar53._2_2_;
  uVar93 = (sVar55 < (short)uVar93) * uVar93 | (ushort)(sVar55 >= (short)uVar93) * sVar55;
  sVar55 = auVar53._4_2_;
  uVar94 = (sVar55 < (short)uVar94) * uVar94 | (ushort)(sVar55 >= (short)uVar94) * sVar55;
  sVar55 = auVar53._6_2_;
  uVar95 = (sVar55 < (short)uVar95) * uVar95 | (ushort)(sVar55 >= (short)uVar95) * sVar55;
  sVar55 = auVar53._8_2_;
  uVar96 = (sVar55 < (short)uVar96) * uVar96 | (ushort)(sVar55 >= (short)uVar96) * sVar55;
  sVar55 = auVar53._10_2_;
  uVar97 = (sVar55 < (short)uVar97) * uVar97 | (ushort)(sVar55 >= (short)uVar97) * sVar55;
  sVar55 = auVar53._12_2_;
  sVar61 = auVar53._14_2_;
  uVar98 = (sVar55 < (short)uVar98) * uVar98 | (ushort)(sVar55 >= (short)uVar98) * sVar55;
  uVar99 = (sVar61 < (short)uVar99) * uVar99 | (ushort)(sVar61 >= (short)uVar99) * sVar61;
  auVar58._0_2_ =
       ((short)uVar96 < (short)uVar92) * uVar92 | ((short)uVar96 >= (short)uVar92) * uVar96;
  auVar58._2_2_ =
       ((short)uVar97 < (short)uVar93) * uVar93 | ((short)uVar97 >= (short)uVar93) * uVar97;
  auVar58._4_2_ =
       ((short)uVar98 < (short)uVar94) * uVar94 | ((short)uVar98 >= (short)uVar94) * uVar98;
  auVar58._6_2_ =
       ((short)uVar99 < (short)uVar95) * uVar95 | ((short)uVar99 >= (short)uVar95) * uVar99;
  auVar58._8_2_ = (0 < (short)uVar96) * uVar96;
  auVar58._10_2_ = (0 < (short)uVar97) * uVar97;
  auVar58._12_2_ = (0 < (short)uVar98) * uVar98;
  auVar58._14_2_ = (0 < (short)uVar99) * uVar99;
  auVar52 = psubusw(auVar58,auVar46);
  auVar59._0_2_ = -(ushort)(auVar52._0_2_ == 0);
  auVar59._2_2_ = -(ushort)(auVar52._2_2_ == 0);
  auVar59._4_2_ = -(ushort)(auVar52._4_2_ == 0);
  auVar59._6_2_ = -(ushort)(auVar52._6_2_ == 0);
  auVar59._8_2_ = -(ushort)(auVar52._8_2_ == 0);
  auVar59._10_2_ = -(ushort)(auVar52._10_2_ == 0);
  auVar59._12_2_ = -(ushort)(auVar52._12_2_ == 0);
  auVar59._14_2_ = -(ushort)(auVar52._14_2_ == 0);
  auVar59 = auVar59 & auVar81;
  auVar50._0_8_ = auVar59._0_8_;
  auVar50._8_4_ = auVar59._0_4_;
  auVar50._12_4_ = auVar59._4_4_;
  auVar70._0_2_ = -(ushort)(auVar59._0_2_ == 0);
  auVar70._2_2_ = -(ushort)(auVar59._2_2_ == 0);
  auVar70._4_2_ = -(ushort)(auVar59._4_2_ == 0);
  auVar70._6_2_ = -(ushort)(auVar59._6_2_ == 0);
  auVar70._8_2_ = -(ushort)(auVar59._0_2_ == 0);
  auVar70._10_2_ = -(ushort)(auVar59._2_2_ == 0);
  auVar70._12_2_ = -(ushort)(auVar59._4_2_ == 0);
  auVar70._14_2_ = -(ushort)(auVar59._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) | (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar70._14_2_ >> 7) & 1) << 0xe | auVar70._14_2_ & 0x8000) != 0xffff
     ) {
    auVar24._2_2_ = sStack_206;
    auVar24._0_2_ = local_208;
    auVar24._4_2_ = sStack_204;
    auVar24._6_2_ = sStack_202;
    auVar24._8_2_ = sStack_200;
    auVar24._10_2_ = sStack_1fe;
    auVar24._12_2_ = sStack_1fc;
    auVar24._14_2_ = sStack_1fa;
    auVar25._2_2_ = sStack_1f6;
    auVar25._0_2_ = local_1f8;
    auVar25._4_2_ = sStack_1f4;
    auVar25._6_2_ = sStack_1f2;
    auVar25._8_2_ = sStack_1f0;
    auVar25._10_2_ = sStack_1ee;
    auVar25._12_2_ = sStack_1ec;
    auVar25._14_2_ = sStack_1ea;
    auVar53 = psubusw(auVar76,auVar24);
    auVar52 = psubusw(auVar24,auVar76);
    auVar52 = auVar52 | auVar53;
    auVar56 = psubusw(auVar76,auVar25);
    auVar53 = psubusw(auVar25,auVar76);
    auVar53 = auVar53 | auVar56;
    sVar55 = auVar52._0_2_;
    sVar61 = auVar53._0_2_;
    uVar92 = (ushort)(sVar61 < sVar55) * sVar55 | (ushort)(sVar61 >= sVar55) * sVar61;
    sVar55 = auVar52._2_2_;
    sVar61 = auVar53._2_2_;
    uVar93 = (ushort)(sVar61 < sVar55) * sVar55 | (ushort)(sVar61 >= sVar55) * sVar61;
    sVar55 = auVar52._4_2_;
    sVar61 = auVar53._4_2_;
    uVar94 = (ushort)(sVar61 < sVar55) * sVar55 | (ushort)(sVar61 >= sVar55) * sVar61;
    sVar55 = auVar52._6_2_;
    sVar61 = auVar53._6_2_;
    uVar95 = (ushort)(sVar61 < sVar55) * sVar55 | (ushort)(sVar61 >= sVar55) * sVar61;
    sVar55 = auVar52._8_2_;
    sVar61 = auVar53._8_2_;
    uVar96 = (ushort)(sVar61 < sVar55) * sVar55 | (ushort)(sVar61 >= sVar55) * sVar61;
    sVar55 = auVar52._10_2_;
    sVar61 = auVar53._10_2_;
    uVar97 = (ushort)(sVar61 < sVar55) * sVar55 | (ushort)(sVar61 >= sVar55) * sVar61;
    sVar55 = auVar52._12_2_;
    sVar61 = auVar53._12_2_;
    sVar62 = auVar53._14_2_;
    uVar98 = (ushort)(sVar61 < sVar55) * sVar55 | (ushort)(sVar61 >= sVar55) * sVar61;
    sVar55 = auVar52._14_2_;
    uVar99 = (ushort)(sVar62 < sVar55) * sVar55 | (ushort)(sVar62 >= sVar55) * sVar62;
    auVar53 = psubusw(local_1e8,auVar76);
    auVar52 = psubusw(auVar76,local_1e8);
    auVar52 = auVar52 | auVar53;
    sVar55 = auVar52._0_2_;
    uVar92 = (sVar55 < (short)uVar92) * uVar92 | (ushort)(sVar55 >= (short)uVar92) * sVar55;
    sVar55 = auVar52._2_2_;
    uVar93 = (sVar55 < (short)uVar93) * uVar93 | (ushort)(sVar55 >= (short)uVar93) * sVar55;
    sVar55 = auVar52._4_2_;
    uVar94 = (sVar55 < (short)uVar94) * uVar94 | (ushort)(sVar55 >= (short)uVar94) * sVar55;
    sVar55 = auVar52._6_2_;
    uVar95 = (sVar55 < (short)uVar95) * uVar95 | (ushort)(sVar55 >= (short)uVar95) * sVar55;
    sVar55 = auVar52._8_2_;
    uVar96 = (sVar55 < (short)uVar96) * uVar96 | (ushort)(sVar55 >= (short)uVar96) * sVar55;
    sVar55 = auVar52._10_2_;
    uVar97 = (sVar55 < (short)uVar97) * uVar97 | (ushort)(sVar55 >= (short)uVar97) * sVar55;
    sVar55 = auVar52._12_2_;
    sVar61 = auVar52._14_2_;
    uVar98 = (sVar55 < (short)uVar98) * uVar98 | (ushort)(sVar55 >= (short)uVar98) * sVar55;
    uVar99 = (sVar61 < (short)uVar99) * uVar99 | (ushort)(sVar61 >= (short)uVar99) * sVar61;
    auVar84._0_2_ =
         ((short)uVar96 < (short)uVar92) * uVar92 | ((short)uVar96 >= (short)uVar92) * uVar96;
    auVar84._2_2_ =
         ((short)uVar97 < (short)uVar93) * uVar93 | ((short)uVar97 >= (short)uVar93) * uVar97;
    auVar84._4_2_ =
         ((short)uVar98 < (short)uVar94) * uVar94 | ((short)uVar98 >= (short)uVar94) * uVar98;
    auVar84._6_2_ =
         ((short)uVar99 < (short)uVar95) * uVar95 | ((short)uVar99 >= (short)uVar95) * uVar99;
    auVar84._8_2_ = (0 < (short)uVar96) * uVar96;
    auVar84._10_2_ = (0 < (short)uVar97) * uVar97;
    auVar84._12_2_ = (0 < (short)uVar98) * uVar98;
    auVar84._14_2_ = (0 < (short)uVar99) * uVar99;
    auVar52 = psubusw(auVar84,auVar46);
    auVar85._0_2_ = -(ushort)(auVar52._0_2_ == 0);
    auVar85._2_2_ = -(ushort)(auVar52._2_2_ == 0);
    auVar85._4_2_ = -(ushort)(auVar52._4_2_ == 0);
    auVar85._6_2_ = -(ushort)(auVar52._6_2_ == 0);
    auVar85._8_2_ = -(ushort)(auVar52._8_2_ == 0);
    auVar85._10_2_ = -(ushort)(auVar52._10_2_ == 0);
    auVar85._12_2_ = -(ushort)(auVar52._12_2_ == 0);
    auVar85._14_2_ = -(ushort)(auVar52._14_2_ == 0);
    auVar85 = auVar85 & auVar59;
    sVar100 = local_238 + local_248 + local_228;
    sVar101 = sStack_236 + sStack_246 + sStack_226;
    sVar102 = sStack_234 + sStack_244 + sStack_224;
    sVar103 = sStack_232 + sStack_242 + sStack_222;
    sVar104 = sStack_230 + sStack_240 + sStack_220;
    sVar105 = sStack_22e + sStack_23e + sStack_21e;
    sVar106 = sStack_22c + sStack_23c + sStack_21c;
    sVar107 = sStack_22a + sStack_23a + sStack_21a;
    sVar55 = sVar104 + sVar100 + 4;
    sVar61 = sVar105 + sVar101 + 4;
    sVar62 = sVar106 + sVar102 + 4;
    sVar63 = sVar107 + sVar103 + 4;
    local_1c8 = local_248;
    sStack_1c6 = sStack_246;
    sStack_1c4 = sStack_244;
    sStack_1c2 = sStack_242;
    sStack_1c0 = sStack_240;
    sStack_1be = sStack_23e;
    sStack_1bc = sStack_23c;
    sStack_1ba = sStack_23a;
    local_1b8 = local_b8;
    sStack_1b6 = sStack_b6;
    sStack_1b4 = sStack_b4;
    sStack_1b2 = sStack_b2;
    uStack_1b0 = uStack_b0;
    uStack_1ae = uStack_ae;
    uStack_1ac = uStack_ac;
    uStack_1aa = uStack_aa;
    local_1a8 = local_c8;
    sStack_1a6 = sStack_c6;
    sStack_1a4 = sStack_c4;
    sStack_1a2 = sStack_c2;
    uStack_1a0 = uStack_c0;
    uStack_19e = uStack_be;
    uStack_19c = uStack_bc;
    uStack_19a = uStack_ba;
    local_178 = (ushort)(local_248 + local_218 + sVar55) >> 3;
    uStack_176 = (ushort)(sStack_246 + sStack_216 + sVar61) >> 3;
    uStack_174 = (ushort)(sStack_244 + sStack_214 + sVar62) >> 3;
    uStack_172 = (ushort)(sStack_242 + sStack_212 + sVar63) >> 3;
    uStack_170 = (ushort)(local_e8 + local_b8 + sVar55) >> 3;
    uStack_16e = (ushort)(sStack_e6 + sStack_b6 + sVar61) >> 3;
    uStack_16c = (ushort)(sStack_e4 + sStack_b4 + sVar62) >> 3;
    uStack_16a = (ushort)(sStack_e2 + sStack_b2 + sVar63) >> 3;
    auVar54._0_8_ = auVar85._0_8_;
    auVar54._8_4_ = auVar85._0_4_;
    auVar54._12_4_ = auVar85._4_4_;
    local_168 = (ushort)((sVar55 - local_c8) + local_238 + local_218 * 2) >> 3;
    uStack_166 = (ushort)((sVar61 - sStack_c6) + sStack_236 + sStack_216 * 2) >> 3;
    uStack_164 = (ushort)((sVar62 - sStack_c4) + sStack_234 + sStack_214 * 2) >> 3;
    uStack_162 = (ushort)((sVar63 - sStack_c2) + sStack_232 + sStack_212 * 2) >> 3;
    uStack_160 = (ushort)((sVar55 - local_228) + sStack_230 + sStack_210 * 2) >> 3;
    uStack_15e = (ushort)((sVar61 - sStack_226) + sStack_22e + sStack_20e * 2) >> 3;
    uStack_15c = (ushort)((sVar62 - sStack_224) + sStack_22c + sStack_20c * 2) >> 3;
    uStack_15a = (ushort)((sVar63 - sStack_222) + sStack_22a + sStack_20a * 2) >> 3;
    local_198 = local_228;
    sStack_196 = sStack_226;
    sStack_194 = sStack_224;
    sStack_192 = sStack_222;
    sStack_190 = sStack_220;
    sStack_18e = sStack_21e;
    sStack_18c = sStack_21c;
    sStack_18a = sStack_21a;
    local_188 = local_238;
    sStack_186 = sStack_236;
    sStack_184 = sStack_234;
    sStack_182 = sStack_232;
    sStack_180 = sStack_230;
    sStack_17e = sStack_22e;
    sStack_17c = sStack_22c;
    sStack_17a = sStack_22a;
    local_158 = (ushort)(((sVar55 - local_c8) + local_228 + local_218 * 3) - local_d8) >> 3;
    uStack_156 = (ushort)(((sVar61 - sStack_c6) + sStack_226 + sStack_216 * 3) - sStack_d6) >> 3;
    uStack_154 = (ushort)(((sVar62 - sStack_c4) + sStack_224 + sStack_214 * 3) - sStack_d4) >> 3;
    uStack_152 = (ushort)(((sVar63 - sStack_c2) + sStack_222 + sStack_212 * 3) - sStack_d2) >> 3;
    uStack_150 = (ushort)(((sStack_220 + sStack_210 * 3) - local_238) + (sVar55 - local_228)) >> 3;
    uStack_14e = (ushort)(((sStack_21e + sStack_20e * 3) - sStack_236) + (sVar61 - sStack_226)) >> 3
    ;
    uStack_14c = (ushort)(((sStack_21c + sStack_20c * 3) - sStack_234) + (sVar62 - sStack_224)) >> 3
    ;
    uStack_14a = (ushort)(((sStack_21a + sStack_20a * 3) - sStack_232) + (sVar63 - sStack_222)) >> 3
    ;
    auVar60._0_2_ = -(ushort)(auVar85._0_2_ == 0);
    auVar60._2_2_ = -(ushort)(auVar85._2_2_ == 0);
    auVar60._4_2_ = -(ushort)(auVar85._4_2_ == 0);
    auVar60._6_2_ = -(ushort)(auVar85._6_2_ == 0);
    auVar60._8_2_ = -(ushort)(auVar85._0_2_ == 0);
    auVar60._10_2_ = -(ushort)(auVar85._2_2_ == 0);
    auVar60._12_2_ = -(ushort)(auVar85._4_2_ == 0);
    auVar60._14_2_ = -(ushort)(auVar85._6_2_ == 0);
    uVar92 = ((ushort)(SUB161(auVar60 >> 7,0) & 1) | (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
              (ushort)((byte)(auVar60._14_2_ >> 7) & 1) << 0xe | auVar60._14_2_ & 0x8000) ^ 0xffff;
    if (uVar92 != 0) {
      local_1d8 = local_d8;
      sStack_1d6 = sStack_d6;
      sStack_1d4 = sStack_d4;
      sStack_1d2 = sStack_d2;
      uStack_1d0 = uStack_d0;
      uStack_1ce = uStack_ce;
      uStack_1cc = uStack_cc;
      uStack_1ca = uStack_ca;
      sVar55 = local_208 + local_1f8 + local_218;
      sVar61 = sStack_206 + sStack_1f6 + sStack_216;
      sVar62 = sStack_204 + sStack_1f4 + sStack_214;
      sVar63 = sStack_202 + sStack_1f2 + sStack_212;
      sVar64 = sStack_200 + sStack_1f0 + sStack_210;
      sVar65 = sStack_1fe + sStack_1ee + sStack_20e;
      sVar66 = sStack_1fc + sStack_1ec + sStack_20c;
      sVar67 = sStack_1fa + sStack_1ea + sStack_20a;
      sVar68 = sVar64 + sVar104 + sVar55 + sVar100 + 8;
      sVar71 = sVar65 + sVar105 + sVar61 + sVar101 + 8;
      sVar72 = sVar66 + sVar106 + sVar62 + sVar102 + 8;
      sVar73 = sVar67 + sVar107 + sVar63 + sVar103 + 8;
      sVar82 = local_1e8._0_2_;
      sVar86 = local_1e8._2_2_;
      sVar87 = local_1e8._4_2_;
      sVar88 = local_1e8._6_2_;
      sVar40 = local_1e8._8_2_;
      sVar45 = local_1e8._10_2_;
      sVar89 = local_1e8._12_2_;
      sVar90 = local_1e8._14_2_;
      local_148 = (ushort)(sVar68 + local_e8 + local_238 + local_248 + sVar82) >> 4;
      uStack_146 = (ushort)(sVar71 + sStack_e6 + sStack_236 + sStack_246 + sVar86) >> 4;
      uStack_144 = (ushort)(sVar72 + sStack_e4 + sStack_234 + sStack_244 + sVar87) >> 4;
      uStack_142 = (ushort)(sVar73 + sStack_e2 + sStack_232 + sStack_242 + sVar88) >> 4;
      uStack_140 = (ushort)(sStack_230 + sStack_240 + sVar40 + local_248 + sVar68) >> 4;
      uStack_13e = (ushort)(sStack_22e + sStack_23e + sVar45 + sStack_246 + sVar71) >> 4;
      uStack_13c = (ushort)(sStack_22c + sStack_23c + sVar89 + sStack_244 + sVar72) >> 4;
      uStack_13a = (ushort)(sStack_22a + sStack_23a + sVar90 + sStack_242 + sVar73) >> 4;
      local_138 = (ushort)((sVar68 - local_98) + sVar100 + sVar82 * 2) >> 4;
      uStack_136 = (ushort)((sVar71 - sStack_96) + sVar101 + sVar86 * 2) >> 4;
      uStack_134 = (ushort)((sVar72 - sStack_94) + sVar102 + sVar87 * 2) >> 4;
      uStack_132 = (ushort)((sVar73 - sStack_92) + sVar103 + sVar88 * 2) >> 4;
      uStack_130 = (ushort)((sVar68 - local_1f8) + sVar104 + sVar40 * 2) >> 4;
      uStack_12e = (ushort)((sVar71 - sStack_1f6) + sVar105 + sVar45 * 2) >> 4;
      uStack_12c = (ushort)((sVar72 - sStack_1f4) + sVar106 + sVar89 * 2) >> 4;
      uStack_12a = (ushort)((sVar73 - sStack_1f2) + sVar107 + sVar90 * 2) >> 4;
      sVar100 = (sVar68 - local_98) - local_a8;
      sVar101 = (sVar71 - sStack_96) - sStack_a6;
      sVar102 = (sVar72 - sStack_94) - sStack_a4;
      sVar103 = (sVar73 - sStack_92) - sStack_a2;
      sVar104 = (sVar68 - local_1f8) - local_208;
      sVar105 = (sVar71 - sStack_1f6) - sStack_206;
      sVar106 = (sVar72 - sStack_1f4) - sStack_204;
      sVar107 = (sVar73 - sStack_1f2) - sStack_202;
      local_128 = (ushort)(sVar100 + local_238 + local_228 + local_218 + sVar82 * 3) >> 4;
      uStack_126 = (ushort)(sVar101 + sStack_236 + sStack_226 + sStack_216 + sVar86 * 3) >> 4;
      uStack_124 = (ushort)(sVar102 + sStack_234 + sStack_224 + sStack_214 + sVar87 * 3) >> 4;
      uStack_122 = (ushort)(sVar103 + sStack_232 + sStack_222 + sStack_212 + sVar88 * 3) >> 4;
      uStack_120 = (ushort)(sVar104 + sStack_230 + sStack_220 + sStack_210 + sVar40 * 3) >> 4;
      uStack_11e = (ushort)(sVar105 + sStack_22e + sStack_21e + sStack_20e + sVar45 * 3) >> 4;
      uStack_11c = (ushort)(sVar106 + sStack_22c + sStack_21c + sStack_20c + sVar89 * 3) >> 4;
      uStack_11a = (ushort)(sVar107 + sStack_22a + sStack_21a + sStack_20a + sVar90 * 3) >> 4;
      sVar100 = sVar100 - local_b8;
      sVar101 = sVar101 - sStack_b6;
      sVar102 = sVar102 - sStack_b4;
      sVar103 = sVar103 - sStack_b2;
      auVar52 = psllw(local_1e8,2);
      sVar104 = sVar104 - local_218;
      sVar105 = sVar105 - sStack_216;
      sVar106 = sVar106 - sStack_214;
      sVar107 = sVar107 - sStack_212;
      local_118 = (ushort)(sVar100 + local_218 + local_208 + local_228 + auVar52._0_2_) >> 4;
      uStack_116 = (ushort)(sVar101 + sStack_216 + sStack_206 + sStack_226 + auVar52._2_2_) >> 4;
      uStack_114 = (ushort)(sVar102 + sStack_214 + sStack_204 + sStack_224 + auVar52._4_2_) >> 4;
      uStack_112 = (ushort)(sVar103 + sStack_212 + sStack_202 + sStack_222 + auVar52._6_2_) >> 4;
      uStack_110 = (ushort)(sVar104 + sStack_210 + sStack_200 + sStack_220 + auVar52._8_2_) >> 4;
      uStack_10e = (ushort)(sVar105 + sStack_20e + sStack_1fe + sStack_21e + auVar52._10_2_) >> 4;
      uStack_10c = (ushort)(sVar106 + sStack_20c + sStack_1fc + sStack_21c + auVar52._12_2_) >> 4;
      uStack_10a = (ushort)(sVar107 + sStack_20a + sStack_1fa + sStack_21a + auVar52._14_2_) >> 4;
      sVar100 = sVar100 - local_c8;
      sVar101 = sVar101 - sStack_c6;
      sVar102 = sVar102 - sStack_c4;
      sVar103 = sVar103 - sStack_c2;
      sVar104 = sVar104 - local_228;
      sVar105 = sVar105 - sStack_226;
      sVar106 = sVar106 - sStack_224;
      sVar107 = sVar107 - sStack_222;
      local_108 = (ushort)(sVar100 + auVar52._0_2_ + sVar82 + sVar55) >> 4;
      uStack_106 = (ushort)(sVar101 + auVar52._2_2_ + sVar86 + sVar61) >> 4;
      uStack_104 = (ushort)(sVar102 + auVar52._4_2_ + sVar87 + sVar62) >> 4;
      uStack_102 = (ushort)(sVar103 + auVar52._6_2_ + sVar88 + sVar63) >> 4;
      uStack_100 = (ushort)(sVar104 + auVar52._8_2_ + sVar40 + sVar64) >> 4;
      uStack_fe = (ushort)(sVar105 + auVar52._10_2_ + sVar45 + sVar65) >> 4;
      uStack_fc = (ushort)(sVar106 + auVar52._12_2_ + sVar89 + sVar66) >> 4;
      uStack_fa = (ushort)(sVar107 + auVar52._14_2_ + sVar90 + sVar67) >> 4;
      local_f8 = (ushort)(((local_208 + local_1f8 + sVar82 * 7) - local_d8) + sVar100) >> 4;
      uStack_f6 = (ushort)(((sStack_206 + sStack_1f6 + sVar86 * 7) - sStack_d6) + sVar101) >> 4;
      uStack_f4 = (ushort)(((sStack_204 + sStack_1f4 + sVar87 * 7) - sStack_d4) + sVar102) >> 4;
      uStack_f2 = (ushort)(((sStack_202 + sStack_1f2 + sVar88 * 7) - sStack_d2) + sVar103) >> 4;
      uStack_f0 = (ushort)(((sStack_200 + sStack_1f0 + sVar40 * 7) - local_238) + sVar104) >> 4;
      uStack_ee = (ushort)(((sStack_1fe + sStack_1ee + sVar45 * 7) - sStack_236) + sVar105) >> 4;
      uStack_ec = (ushort)(((sStack_1fc + sStack_1ec + sVar89 * 7) - sStack_234) + sVar106) >> 4;
      uStack_ea = (ushort)(((sStack_1fa + sStack_1ea + sVar90 * 7) - sStack_232) + sVar107) >> 4;
    }
    auVar43._8_4_ = 0xffffffff;
    auVar43._0_8_ = 0xffffffffffffffff;
    auVar43._12_4_ = 0xffffffff;
    uVar37 = (ulong)(uint)(0 << bVar1);
    do {
      auVar52 = *(undefined1 (*) [16])((long)&local_178 + uVar37) & auVar50;
      *(undefined1 (*) [16])((long)&local_178 + uVar37) = auVar52;
      *(undefined1 (*) [16])((long)&local_248 + uVar37) =
           auVar52 | *(undefined1 (*) [16])((long)&local_248 + uVar37) & (auVar43 ^ auVar50);
      uVar37 = uVar37 + 0x10;
    } while (uVar37 != 0x30);
    if (uVar92 != 0) {
      auVar44._8_4_ = 0xffffffff;
      auVar44._0_8_ = 0xffffffffffffffff;
      auVar44._12_4_ = 0xffffffff;
      lVar39 = 0;
      do {
        auVar52 = *(undefined1 (*) [16])((long)&local_148 + lVar39) & auVar54;
        *(undefined1 (*) [16])((long)&local_148 + lVar39) = auVar52;
        *(undefined1 (*) [16])((long)&local_248 + lVar39) =
             auVar52 | *(undefined1 (*) [16])((long)&local_248 + lVar39) & (auVar44 ^ auVar54);
        lVar39 = lVar39 + 0x10;
      } while (lVar39 != 0x60);
    }
  }
  puVar36 = s + -lVar35;
  lVar39 = 0;
  do {
    uVar23 = *(undefined8 *)((long)&sStack_240 + lVar39);
    *(undefined8 *)puVar36 = *(undefined8 *)((long)&local_248 + lVar39);
    *(undefined8 *)s = uVar23;
    puVar36 = puVar36 + -lVar35;
    s = s + lVar35;
    lVar39 = lVar39 + 0x10;
  } while (lVar39 != 0x60);
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_14_sse2(uint16_t *s, int pitch,
                                       const uint8_t *blimit,
                                       const uint8_t *limit,
                                       const uint8_t *thresh, int bd) {
  __m128i p[7], q[7], pq[7];
  int i;

  for (i = 0; i < 7; i++) {
    p[i] = _mm_loadl_epi64((__m128i *)(s - (i + 1) * pitch));
    q[i] = _mm_loadl_epi64((__m128i *)(s + i * pitch));
  }

  highbd_lpf_internal_14_sse2(p, q, pq, blimit, limit, thresh, bd);

  for (i = 0; i < 6; i++) {
    _mm_storel_epi64((__m128i *)(s - (i + 1) * pitch), pq[i]);
    _mm_storel_epi64((__m128i *)(s + i * pitch), _mm_srli_si128(pq[i], 8));
  }
}